

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O3

shared_ptr<duckdb::BaseFileReader,_true> __thiscall
duckdb::ParquetMultiFileInfo::CreateReader
          (ParquetMultiFileInfo *this,ClientContext *context,GlobalTableFunctionState *param_2,
          OpenFileInfo *file,idx_t file_idx,MultiFileBindData *multi_bind_data)

{
  ParquetReader *pPVar1;
  pointer pTVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<duckdb::BaseFileReader,_true> sVar4;
  undefined1 local_31;
  ParquetReader *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  pTVar2 = unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
           ::operator->(&multi_bind_data->bind_data);
  local_30 = (ParquetReader *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ParquetReader,std::allocator<duckdb::ParquetReader>,duckdb::ClientContext&,duckdb::OpenFileInfo_const&,duckdb::ParquetOptions&>
            (&local_28,&local_30,(allocator<duckdb::ParquetReader> *)&local_31,context,file,
             (ParquetOptions *)
             &pTVar2[1].column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pPVar1 = local_30;
  _Var3._M_pi = extraout_RDX;
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_28._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_01c5cb35;
    }
    else {
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
    _Var3._M_pi = extraout_RDX_00;
  }
LAB_01c5cb35:
  *(ParquetReader **)this = pPVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = local_28._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::BaseFileReader,_true>)
         sVar4.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BaseFileReader> ParquetMultiFileInfo::CreateReader(ClientContext &context, GlobalTableFunctionState &,
                                                              const OpenFileInfo &file, idx_t file_idx,
                                                              const MultiFileBindData &multi_bind_data) {
	auto &bind_data = multi_bind_data.bind_data->Cast<ParquetReadBindData>();
	return make_shared_ptr<ParquetReader>(context, file, bind_data.parquet_options);
}